

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.hpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::
UpdId<ot::commissioner::persistent_storage::BorderRouter>
          (PersistentStorageJson *this,BorderRouter *aNewValue,string *aArrName)

{
  json *this_00;
  bool bVar1;
  Status SVar2;
  reference pvVar3;
  reference this_01;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  itValue;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_c0;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b0;
  iterator local_90;
  iterator local_70;
  iterator local_50;
  
  this_00 = &this->mCache;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin(&local_50,pvVar3);
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_70,pvVar3);
  std::
  find_if<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,ot::commissioner::persistent_storage::PersistentStorageJson::UpdId<ot::commissioner::persistent_storage::BorderRouter>(ot::commissioner::persistent_storage::BorderRouter_const&,std::__cxx11::string)::_lambda(ot::commissioner::persistent_storage::BorderRouter_const&)_1_>
            (&local_b0,&local_50,&local_70,(anon_class_8_1_98f1f5d2_for__M_pred_conflict2)aNewValue)
  ;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](this_00,aArrName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end(&local_90,pvVar3);
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_b0,&local_90);
  SVar2 = kNotFound;
  if (!bVar1) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<const_ot::commissioner::persistent_storage::BorderRouter_&,_ot::commissioner::persistent_storage::BorderRouter,_0>
              (&local_c0,aNewValue);
    this_01 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*(&local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(this_01,&local_c0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_c0);
    SVar2 = CacheToFile(this);
  }
  return SVar2;
}

Assistant:

Status UpdId(V const &aNewValue, std::string aArrName)
    {
        auto itValue = std::find_if(std::begin(mCache[aArrName]), std::end(mCache[aArrName]),
                                    [&aNewValue](const V &el) { return el.mId.mId == aNewValue.mId.mId; });
        if (itValue == std::end(mCache[aArrName]))
        {
            return Status::kNotFound;
        }

        *itValue = aNewValue;

        return CacheToFile();
    }